

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void clearbyvalues(global_State *g,GCObject *l,GCObject *f)

{
  byte bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  GCObject *pGVar5;
  GCObject *local_68;
  GCObject *local_58;
  TValue *o;
  uint asize;
  uint i;
  Node *limit;
  Node *n;
  Table *h;
  GCObject *f_local;
  GCObject *l_local;
  global_State *g_local;
  
  for (f_local = l; f_local != f; f_local = f_local[3].next) {
    lVar2 = *(long *)&f_local[1].tt;
    bVar1 = f_local->field_0xb;
    uVar3 = luaH_realasize((Table *)f_local);
    for (o._4_4_ = 0; o._4_4_ < uVar3; o._4_4_ = o._4_4_ + 1) {
      pGVar5 = f_local[1].next + o._4_4_;
      if ((pGVar5->tt & 0x40) == 0) {
        local_58 = (GCObject *)0x0;
      }
      else {
        local_58 = pGVar5->next;
      }
      iVar4 = iscleared(g,local_58);
      if (iVar4 != 0) {
        pGVar5->tt = '\x10';
      }
    }
    for (limit = *(Node **)&f_local[1].tt;
        limit < (Node *)(lVar2 + (long)(1 << (bVar1 & 0x1f)) * 0x18); limit = limit + 1) {
      if (((limit->u).tt_ & 0x40) == 0) {
        local_68 = (GCObject *)0x0;
      }
      else {
        local_68 = (limit->u).value_.gc;
      }
      iVar4 = iscleared(g,local_68);
      if (iVar4 != 0) {
        (limit->u).tt_ = '\x10';
      }
      if (((limit->u).tt_ & 0xf) == 0) {
        clearkey(limit);
      }
    }
  }
  return;
}

Assistant:

static void clearbyvalues (global_State *g, GCObject *l, GCObject *f) {
  for (; l != f; l = gco2t(l)->gclist) {
    Table *h = gco2t(l);
    Node *n, *limit = gnodelast(h);
    unsigned int i;
    unsigned int asize = luaH_realasize(h);
    for (i = 0; i < asize; i++) {
      TValue *o = &h->array[i];
      if (iscleared(g, gcvalueN(o)))  /* value was collected? */
        setempty(o);  /* remove entry */
    }
    for (n = gnode(h, 0); n < limit; n++) {
      if (iscleared(g, gcvalueN(gval(n))))  /* unmarked value? */
        setempty(gval(n));  /* remove entry */
      if (isempty(gval(n)))  /* is entry empty? */
        clearkey(n);  /* clear its key */
    }
  }
}